

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chared.c
# Opt level: O1

void c_insert(EditLine *el,wchar_t num)

{
  wchar_t *pwVar1;
  wchar_t *pwVar2;
  wchar_t wVar3;
  wchar_t *pwVar4;
  size_t addlen;
  
  addlen = (size_t)num;
  if (((el->el_line).lastchar + addlen < (el->el_line).limit) ||
     (wVar3 = ch_enlargebufs(el,addlen), wVar3 != L'\0')) {
    pwVar1 = (el->el_line).cursor;
    pwVar2 = (el->el_line).lastchar;
    pwVar4 = pwVar2;
    if (pwVar1 < pwVar2) {
      do {
        pwVar4[addlen] = *pwVar4;
        pwVar4 = pwVar4 + -1;
      } while (pwVar1 <= pwVar4);
    }
    (el->el_line).lastchar = pwVar2 + addlen;
  }
  return;
}

Assistant:

libedit_private void
c_insert(EditLine *el, int num)
{
	wchar_t *cp;

	if (el->el_line.lastchar + num >= el->el_line.limit) {
		if (!ch_enlargebufs(el, (size_t)num))
			return;		/* can't go past end of buffer */
	}

	if (el->el_line.cursor < el->el_line.lastchar) {
		/* if I must move chars */
		for (cp = el->el_line.lastchar; cp >= el->el_line.cursor; cp--)
			cp[num] = *cp;
	}
	el->el_line.lastchar += num;
}